

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O3

int iemgui_compatible_colorarg(int index,int argc,t_atom *argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  t_float tVar6;
  
  uVar1 = 0;
  if (index < argc && -1 < index) {
    if (argv[(uint)index].a_type != A_FLOAT) {
      iVar3 = iemgui_getcolorarg(index,argc,argv);
      return iVar3;
    }
    tVar6 = atom_getfloatarg(index,argc,argv);
    uVar1 = (uint)tVar6;
    if ((int)uVar1 < 0) {
      uVar1 = ~uVar1 & 0xffffff;
    }
    else {
      uVar5 = 0x1d;
      if (0x1d < uVar1) {
        uVar5 = (ulong)uVar1;
      }
      iVar3 = (int)(uVar5 / 0x1e);
      iVar4 = uVar1 + iVar3 * -0x1e;
      iVar2 = 0;
      if (0 < iVar4) {
        iVar2 = iVar4;
      }
      iVar3 = (iVar2 + iVar3 * 0x1e) - uVar1;
      uVar1 = (uint)(iVar3 != 0);
      uVar1 = iemgui_color_hex[((iVar3 - uVar1) / 0x1e + uVar1) * 0x1e + iVar4];
    }
  }
  return uVar1;
}

Assistant:

int iemgui_compatible_colorarg(int index, int argc, t_atom* argv)
{
    if (index < 0 || index >= argc)
        return 0;
    if(IS_A_FLOAT(argv,index))
        {
            int col=atom_getfloatarg(index, argc, argv);
            if(col >= 0)
            {
                int idx = iemgui_modulo_color(col);
                return(iemgui_color_hex[(idx)]);
            }
            else
               return((-1 -col)&0xffffff);
        }
    return iemgui_getcolorarg(index, argc, argv);
}